

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool __thiscall
ONX_Model::Read(ONX_Model *this,wchar_t *filename,uint table_filter,uint model_object_type_filter,
               ON_TextLog *error_log)

{
  bool bVar1;
  FILE *fp;
  ON_BinaryFile file;
  
  if ((filename != (wchar_t *)0x0) && (fp = ON::OpenFile(filename,L"rb"), fp != (FILE *)0x0)) {
    ON_BinaryFile::ON_BinaryFile(&file,read3dm,fp);
    bVar1 = Read(this,&file.super_ON_BinaryArchive,table_filter,model_object_type_filter,error_log);
    ON::CloseFile(fp);
    ON_BinaryFile::~ON_BinaryFile(&file);
    return bVar1;
  }
  Reset(this);
  return false;
}

Assistant:

bool ONX_Model::Read( 
    const wchar_t* filename,
    unsigned int table_filter,
    unsigned int model_object_type_filter,
    ON_TextLog* error_log
    )
{
  bool bCallReset = true;
  bool rc = false;

  if ( 0 != filename )
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( 0 != fp )
    {
      bCallReset = false;
      ON_BinaryFile file(ON::archive_mode::read3dm,fp);
      rc = Read(file, table_filter, model_object_type_filter, error_log);
      ON::CloseFile(fp);
    }
  }

  if ( bCallReset )
    Reset();

  return rc;
}